

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  char *pcVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong uVar13;
  pointer pbVar14;
  size_type *psVar15;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID id;
  undefined7 in_register_00000011;
  ulong uVar16;
  byte bVar17;
  pointer pMVar18;
  string *inexpr;
  bool bVar19;
  pointer pMVar20;
  pointer pMVar21;
  long lVar22;
  pointer pbVar23;
  string expr;
  string variable;
  GlobMessages globMessages;
  string output;
  Glob g;
  string local_170;
  cmCommand *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  ulong local_108;
  uint local_100;
  uint local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  GlobMessages local_d8;
  char *local_b8;
  undefined8 local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  Glob local_88;
  
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_150 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileCommand.cxx"
                  ,0x2f0,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  uVar13 = CONCAT71(in_register_00000011,recurse) & 0xffffffff;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar2 = pbVar23[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar2,pcVar2 + pbVar23[1]._M_string_length);
  cmsys::Glob::Glob(&local_88);
  bVar17 = (byte)uVar13;
  local_88.Recurse = (bool)bVar17;
  PVar6 = cmMakefile::GetPolicyStatus(local_150->Makefile,CMP0009);
  local_98 = CONCAT44(extraout_var,PVar6);
  pbVar23 = pbVar23 + 2;
  id = extraout_EDX;
  if ((PVar6 < (REQUIRED_ALWAYS|WARN) & bVar17) != 0) {
    uVar16 = 0x101L >> ((char)PVar6 * '\b' & 0x3fU);
    id = (PolicyID)uVar16;
    local_88.RecurseThroughSymlinks = SUB81(uVar16,0);
  }
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = '\0';
  if (pbVar23 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_108 = 0;
  }
  else {
    paVar1 = &local_148.field_2;
    bVar19 = true;
    local_108 = 0;
    local_100 = (uint)CONCAT71(in_register_00000011,recurse);
    local_90 = args;
    do {
      iVar7 = std::__cxx11::string::compare((char *)pbVar23);
      if (iVar7 != 0) {
        if (((char)uVar13 != '\0') &&
           (uVar8 = std::__cxx11::string::compare((char *)pbVar23), (int)uVar8 == 0)) {
          local_88.RecurseThroughSymlinks = true;
          pbVar23 = pbVar23 + 1;
          local_108 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
          if (pbVar23 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS","");
            cmCommand::SetError(local_150,&local_170);
            goto LAB_0034df8e;
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)pbVar23);
        if (iVar7 == 0) {
          if (pbVar23 + 1 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,"GLOB requires a directory after the RELATIVE tag","");
            cmCommand::SetError(local_150,&local_170);
          }
          else {
            cmsys::Glob::SetRelative(&local_88,pbVar23[1]._M_dataplus._M_p);
            pbVar23 = pbVar23 + 2;
            if (pbVar23 !=
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0034d933;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,"GLOB requires a glob expression after the directory",""
                      );
            cmCommand::SetError(local_150,&local_170);
          }
          goto LAB_0034df8e;
        }
LAB_0034d933:
        local_d8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = cmsys::SystemTools::FileIsFullPath((pbVar23->_M_dataplus)._M_p);
        if (bVar5) {
          cmsys::Glob::FindFiles(&local_88,pbVar23,&local_d8);
        }
        else {
          pcVar9 = cmMakefile::GetCurrentSourceDirectory(local_150->Makefile);
          std::__cxx11::string::string((string *)&local_170,pcVar9,(allocator *)&local_148);
          inexpr = pbVar23;
          if (local_170._M_string_length != 0) {
            std::operator+(&local_148,"/",pbVar23);
            std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_148._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            inexpr = &local_170;
          }
          cmsys::Glob::FindFiles(&local_88,inexpr,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_d8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_d8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0034dcfe:
          pvVar12 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
          pbVar14 = (pvVar12->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar14 != pbVar4) {
            uVar13 = (long)pbVar4 - (long)pbVar14 >> 5;
            lVar22 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (pbVar14,pbVar4,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pbVar14,pbVar4);
            pbVar14 = (pvVar12->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((pvVar12->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
              lVar22 = 8;
              uVar13 = 0;
              do {
                if (!bVar19) {
                  std::__cxx11::string::append((char *)&local_b8);
                  pbVar14 = (pvVar12->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                }
                std::__cxx11::string::_M_append
                          ((char *)&local_b8,*(ulong *)((long)pbVar14 + lVar22 + -8));
                uVar13 = uVar13 + 1;
                pbVar14 = (pvVar12->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar22 = lVar22 + 0x20;
                bVar19 = false;
              } while (uVar13 < (ulong)((long)(pvVar12->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar14 >> 5));
            }
          }
          std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                    (&local_d8);
          uVar13 = (ulong)local_100;
          args = local_90;
          id = extraout_EDX_01;
          goto LAB_0034dde4;
        }
        uVar8 = 0;
        pMVar20 = local_d8.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_fc = (uint)uVar8;
          pMVar21 = pMVar20;
          while( true ) {
            pMVar20 = pMVar21 + 1;
            pcVar3 = local_150->Makefile;
            if (pMVar21->type != cyclicRecursion) break;
            std::operator+(&local_f8,"Cyclic recursion detected while globbing for \'",pbVar23);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_148.field_2._M_allocated_capacity = *psVar15;
              local_148.field_2._8_8_ = plVar10[3];
              local_148._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar15;
              local_148._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_148._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_148,
                                         (ulong)(pMVar21->content)._M_dataplus._M_p);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170.field_2._8_8_ = plVar10[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_170._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            pMVar18 = pMVar21 + 1;
            pMVar21 = pMVar20;
            if (pMVar18 ==
                local_d8.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              if ((local_fc & 1) != 0) goto LAB_0034de83;
              goto LAB_0034dcfe;
            }
          }
          std::operator+(&local_f8,"Error has occurred while globbing for \'",pbVar23);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
          psVar15 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_148.field_2._M_allocated_capacity = *psVar15;
            local_148.field_2._8_8_ = plVar10[3];
            local_148._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar15;
            local_148._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_148._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_148,(ulong)(pMVar21->content)._M_dataplus._M_p
                                      );
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          psVar15 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_170.field_2._M_allocated_capacity = *psVar15;
            local_170.field_2._8_8_ = plVar10[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar15;
            local_170._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_170._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          paVar11 = &local_f8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar11) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            paVar11 = extraout_RAX;
          }
          uVar8 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
        } while (pMVar20 !=
                 local_d8.
                 super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
LAB_0034de83:
        std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&local_d8)
        ;
LAB_0034dfaa:
        bVar19 = false;
        goto LAB_0034dfac;
      }
      pbVar23 = pbVar23 + 1;
      if (pbVar23 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
        cmCommand::SetError(local_150,&local_170);
LAB_0034df8e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0034dfaa;
      }
      bVar5 = cmSystemTools::IsOn((pbVar23->_M_dataplus)._M_p);
      if (bVar5) {
        local_88.ListDirs = true;
        local_88.RecurseListDirs = true;
        id = extraout_EDX_00;
      }
      else {
        bVar5 = cmSystemTools::IsOff((pbVar23->_M_dataplus)._M_p);
        if (!bVar5) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
          cmCommand::SetError(local_150,&local_170);
          goto LAB_0034df8e;
        }
        local_88.ListDirs = false;
        local_88.RecurseListDirs = false;
        id = extraout_EDX_02;
      }
LAB_0034dde4:
      bVar17 = (byte)uVar13;
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (((bVar17 != 0) && ((uint)local_98 < 2 && (local_108 & 1) == 0)) &&
     (local_88.FollowedSymlinkCount != 0)) {
    pcVar3 = local_150->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_170,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  bVar19 = true;
  cmMakefile::AddDefinition(local_150->Makefile,&local_128,local_b8);
LAB_0034dfac:
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return bVar19;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::string output;
  bool first = true;
  for (; i != args.end(); ++i) {
    if (*i == "LIST_DIRECTORIES") {
      ++i;
      if (i != args.end()) {
        if (cmSystemTools::IsOn(i->c_str())) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(i->c_str())) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
      continue;
    }

    if (recurse && (*i == "FOLLOW_SYMLINKS")) {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
      }
    }

    if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
      }
    }

    cmsys::Glob::GlobMessages globMessages;
    if (!cmsys::SystemTools::FileIsFullPath(i->c_str())) {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty()) {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
      } else {
        g.FindFiles(*i, &globMessages);
      }
    } else {
      g.FindFiles(*i, &globMessages);
    }

    if (!globMessages.empty()) {
      bool shouldExit = false;
      for (cmsys::Glob::GlobMessagesIterator it = globMessages.begin();
           it != globMessages.end(); ++it) {
        if (it->type == cmsys::Glob::cyclicRecursion) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '" + *i + "':\n" +
              it->content);
        } else {
          this->Makefile->IssueMessage(
            cmake::FATAL_ERROR, "Error has occurred while globbing for '" +
              *i + "' - " + it->content);
          shouldExit = true;
        }
      }
      if (shouldExit) {
        return false;
      }
    }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    std::sort(files.begin(), files.end());
    for (cc = 0; cc < files.size(); cc++) {
      if (!first) {
        output += ";";
      }
      output += files[cc];
      first = false;
    }
  }

  if (recurse && !explicitFollowSymlinks) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
      // Probably not really the expected behavior, but the author explicitly
      // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if (g.GetFollowedSymlinkCount() != 0) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
        }
        break;
    }
  }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}